

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void parseCommandLine(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined4 *puVar5;
  int iVar6;
  char *pcVar7;
  size_t sStack_40;
  
  gRunInfo.doGrammarCaching = false;
  gRunInfo.quiet = false;
  gRunInfo.verbose = false;
  gRunInfo.stopNow = false;
  gRunInfo.dom = false;
  gRunInfo.sax = true;
  gRunInfo.reuseParser = false;
  gRunInfo.inMemory = false;
  gRunInfo.dumpOnErr = false;
  gRunInfo.doSchema = false;
  gRunInfo.schemaFullChecking = false;
  gRunInfo.doNamespaces = false;
  gRunInfo.doInitialParse = false;
  gRunInfo.doNamespacePrefixes = false;
  gRunInfo.valScheme = Val_Auto;
  gRunInfo.numThreads = 2;
  gRunInfo.totalTime = 0;
  gRunInfo.numInputFiles = 0;
  gRunInfo.numParses = 0;
  iVar6 = 1;
  do {
    if (argc <= iVar6) {
      if (gRunInfo.numInputFiles != 0) {
        if ((gRunInfo.numParses != 0) && (gRunInfo.totalTime != 0)) {
          fwrite("Both -parses nnn and -time nnn were specified. Ignoring -time nnn.\n",0x43,1,
                 _stderr);
          return;
        }
        return;
      }
      pcVar7 = "No input XML file specified on command line.\n";
LAB_0010557e:
      sStack_40 = 0x2d;
LAB_00105580:
      fwrite(pcVar7,sStack_40,1,_stderr);
LAB_00105589:
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 1;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    pcVar7 = argv[iVar6];
    iVar2 = strcmp(pcVar7,"-quiet");
    if (iVar2 == 0) {
      gRunInfo.quiet = true;
      uVar3 = gRunInfo.numParses;
    }
    else {
      iVar2 = strcmp(pcVar7,"-verbose");
      uVar3 = gRunInfo.numParses;
      if (iVar2 == 0) {
        gRunInfo.verbose = true;
      }
      else {
        cVar1 = *pcVar7;
        if (cVar1 == '-') {
          if ((pcVar7[1] == 'v') && (pcVar7[2] == '=')) {
            pcVar7 = pcVar7 + 3;
            iVar2 = strcmp(pcVar7,"never");
            if (iVar2 == 0) {
              gRunInfo._16_8_ = gRunInfo._16_8_ & 0xffffffff00000000;
              uVar3 = gRunInfo.numParses;
            }
            else {
              iVar2 = strcmp(pcVar7,"auto");
              if (iVar2 != 0) {
                iVar2 = strcmp(pcVar7,"always");
                if (iVar2 != 0) {
                  fprintf(_stderr,"Unrecognized -v option \"%s\"\n",pcVar7);
                  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar5 = 1;
                  __cxa_throw(puVar5,&int::typeinfo,0);
                }
                goto LAB_0010520f;
              }
              gRunInfo.valScheme = Val_Auto;
              uVar3 = gRunInfo.numParses;
            }
          }
          else if ((pcVar7[1] == 'v') && (pcVar7[2] == '\0')) {
            fwrite("Please note the -v option has been changed to -v=[always | never | auto]\n",0x49
                   ,1,_stderr);
            fwrite("ThreadTest will continue with -v=always\n",0x28,1,_stderr);
LAB_0010520f:
            gRunInfo.valScheme = Val_Always;
            uVar3 = gRunInfo.numParses;
          }
          else if ((pcVar7[1] == 's') && (pcVar7[2] == '\0')) {
            gRunInfo.doSchema = true;
          }
          else if ((pcVar7[1] == 'f') && (pcVar7[2] == '\0')) {
            gRunInfo.schemaFullChecking = true;
          }
          else if ((pcVar7[1] == 'n') && (pcVar7[2] == '\0')) {
            gRunInfo.doNamespaces = true;
          }
          else {
            if ((pcVar7[1] != 'p') || (pcVar7[2] != '\0')) goto LAB_00105290;
            gRunInfo.doNamespacePrefixes = true;
          }
        }
        else {
LAB_00105290:
          iVar2 = strncmp(pcVar7,"-parser=",8);
          if (iVar2 == 0) {
            pcVar7 = pcVar7 + 8;
            iVar2 = strcmp(pcVar7,"dom");
            if (iVar2 == 0) {
              gRunInfo.dom = true;
              gRunInfo.sax = false;
              uVar3 = gRunInfo.numParses;
            }
            else {
              iVar2 = strcmp(pcVar7,"sax");
              if (iVar2 == 0) {
                gRunInfo.dom = false;
                gRunInfo.sax = true;
                uVar3 = gRunInfo.numParses;
              }
              else {
                iVar2 = strcmp(pcVar7,"sax2");
                if (iVar2 != 0) {
                  fprintf(_stderr,"Unrecognized -parser option \"%s\"\n",pcVar7);
                  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar5 = 1;
                  __cxa_throw(puVar5,&int::typeinfo,0);
                }
                gRunInfo.dom = false;
                gRunInfo.sax = false;
                uVar3 = gRunInfo.numParses;
              }
            }
          }
          else {
            iVar2 = strcmp(pcVar7,"-init");
            if (iVar2 == 0) {
              gRunInfo.doInitialParse = true;
              uVar3 = gRunInfo.numParses;
            }
            else {
              iVar2 = strcmp(pcVar7,"-reuse");
              if (iVar2 == 0) {
                gRunInfo.reuseParser = true;
                uVar3 = gRunInfo.numParses;
              }
              else {
                iVar2 = strcmp(pcVar7,"-dump");
                if (iVar2 == 0) {
                  gRunInfo.dumpOnErr = true;
                  uVar3 = gRunInfo.numParses;
                }
                else {
                  iVar2 = strcmp(pcVar7,"-mem");
                  if (iVar2 == 0) {
                    gRunInfo.inMemory = true;
                    uVar3 = gRunInfo.numParses;
                  }
                  else {
                    iVar2 = strcmp(pcVar7,"-threads");
                    if (iVar2 == 0) {
                      iVar6 = iVar6 + 1;
                      if (argc <= iVar6) {
                        pcVar7 = "Invalid -threads option (missing # of threads)\n";
                        sStack_40 = 0x2f;
                        goto LAB_00105580;
                      }
                      iVar2 = atoi(argv[iVar6]);
                      gRunInfo.numThreads = iVar2;
                      uVar3 = gRunInfo.numParses;
                      if (iVar2 < 0) {
                        pcVar7 = "Invalid -threads option (negative # of threads)\n";
                        sStack_40 = 0x30;
                        goto LAB_00105580;
                      }
                    }
                    else {
                      iVar2 = strcmp(pcVar7,"-time");
                      if (iVar2 == 0) {
                        iVar6 = iVar6 + 1;
                        if (argc <= iVar6) {
                          pcVar7 = "Invalid -time option (missing time value)\n";
                          sStack_40 = 0x2a;
                          goto LAB_00105580;
                        }
                        iVar2 = atoi(argv[iVar6]);
                        gRunInfo.totalTime = iVar2;
                        uVar3 = gRunInfo.numParses;
                        if (iVar2 < 1) {
                          pcVar7 = "Invalid -time option (time value < 1)\n";
                          sStack_40 = 0x26;
                          goto LAB_00105580;
                        }
                      }
                      else {
                        iVar2 = strcmp(pcVar7,"-gc");
                        if (iVar2 == 0) {
                          gRunInfo.doGrammarCaching = true;
                          uVar3 = gRunInfo.numParses;
                        }
                        else {
                          iVar2 = strcmp(pcVar7,"-parses");
                          if (iVar2 == 0) {
                            iVar6 = iVar6 + 1;
                            if (argc <= iVar6) {
                              pcVar7 = "Invalid -parses option (missing # of parses)\n";
                              goto LAB_0010557e;
                            }
                            uVar3 = atoi(argv[iVar6]);
                            if ((int)uVar3 < 0) {
                              fwrite("Invalid -parses option (negative # of parses)\n",0x2e,1,
                                     _stderr);
                              puVar5 = (undefined4 *)__cxa_allocate_exception(4);
                              *puVar5 = 1;
                              __cxa_throw(puVar5,&int::typeinfo,0);
                            }
                          }
                          else {
                            if (cVar1 == '-') {
                              fprintf(_stderr,"Unrecognized command line option.  Scanning \"%s\"\n"
                                      ,pcVar7);
                              goto LAB_00105589;
                            }
                            lVar4 = (long)gRunInfo.numInputFiles;
                            gRunInfo.numInputFiles = gRunInfo.numInputFiles + 1;
                            if (0x17 < lVar4) {
                              fprintf(_stderr,"Too many input files.  Limit is %d\n",0x19);
                              goto LAB_00105589;
                            }
                            gRunInfo.files[lVar4].fileName = pcVar7;
                            uVar3 = gRunInfo.numParses;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    gRunInfo.numParses = uVar3;
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void parseCommandLine(int argc, char **argv)
{
    gRunInfo.doGrammarCaching = false;
    gRunInfo.quiet = false;               // Set up defaults for run.
    gRunInfo.verbose = false;
    gRunInfo.stopNow = false;
    gRunInfo.dom = false;
    gRunInfo.sax = true;
    gRunInfo.reuseParser = false;
    gRunInfo.inMemory = false;
    gRunInfo.dumpOnErr = false;
    gRunInfo.doSchema = false;
    gRunInfo.schemaFullChecking = false;
    gRunInfo.doNamespaces = false;
    gRunInfo.doInitialParse = false;
    gRunInfo.doNamespacePrefixes = false;

    gRunInfo.valScheme = SAXParser::Val_Auto;
    gRunInfo.numThreads = 2;
    gRunInfo.totalTime = 0;
    gRunInfo.numInputFiles = 0;
    gRunInfo.numParses = 0;

    try             // Use exceptions for command line syntax errors.
    {
        int argnum = 1;
        while (argnum < argc) {
            if (strcmp(argv[argnum], "-quiet") == 0)
                gRunInfo.quiet = true;
            else if (strcmp(argv[argnum], "-verbose") == 0)
                gRunInfo.verbose = true;
            else if (strncmp(argv[argnum], "-v=", 3) == 0) {
                const char* const parm = &argv[argnum][3];
                if (!strcmp(parm, "never"))
                    gRunInfo.valScheme = SAXParser::Val_Never;
                else if (!strcmp(parm, "auto"))
                    gRunInfo.valScheme = SAXParser::Val_Auto;
                else if (!strcmp(parm, "always"))
                    gRunInfo.valScheme = SAXParser::Val_Always;
                else {
                    fprintf(stderr, "Unrecognized -v option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-v") == 0) {
                fprintf(stderr, "Please note the -v option has been changed to -v=[always | never | auto]\n");
                fprintf(stderr, "ThreadTest will continue with -v=always\n");
                gRunInfo.valScheme = SAXParser::Val_Always;
            }
            else if (strcmp(argv[argnum], "-s") == 0)
                gRunInfo.doSchema = true;
            else if (strcmp(argv[argnum], "-f") == 0)
                gRunInfo.schemaFullChecking = true;
            else if (strcmp(argv[argnum], "-n") == 0)
                gRunInfo.doNamespaces = true;
            else if (strcmp(argv[argnum], "-p") == 0)
                gRunInfo.doNamespacePrefixes = true;
            else if (!strncmp(argv[argnum], "-parser=", 8)) {
                const char* const parm = &argv[argnum][8];
                if (!strcmp(parm, "dom")) {
                    gRunInfo.dom = true;
                    gRunInfo.sax = false;
                }
                else if (!strcmp(parm, "sax")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = true;
                }
                else if (!strcmp(parm, "sax2")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = false;
                }
                else {
                    fprintf(stderr, "Unrecognized -parser option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-init") == 0)
                gRunInfo.doInitialParse = true;
            else if (strcmp(argv[argnum], "-reuse") == 0)
                gRunInfo.reuseParser = true;
            else if (strcmp(argv[argnum], "-dump") == 0)
                gRunInfo.dumpOnErr = true;
            else if (strcmp(argv[argnum], "-mem") == 0)
                gRunInfo.inMemory = true;
            else if (strcmp(argv[argnum], "-threads") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -threads option (missing # of threads)\n");
                    throw 1;
                }
                gRunInfo.numThreads = atoi(argv[argnum]);
                if (gRunInfo.numThreads < 0) {
                    fprintf(stderr, "Invalid -threads option (negative # of threads)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-time") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -time option (missing time value)\n");
                    throw 1;
                }
                gRunInfo.totalTime = atoi(argv[argnum]);
                if (gRunInfo.totalTime < 1) {
                    fprintf(stderr, "Invalid -time option (time value < 1)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-gc") == 0)
                gRunInfo.doGrammarCaching = true;
            else if (strcmp(argv[argnum], "-parses") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -parses option (missing # of parses)\n");
                    throw 1;
                }
                int temp = atoi(argv[argnum]);
                if (temp < 0) {
                    fprintf(stderr, "Invalid -parses option (negative # of parses)\n");
                    throw 1;
                }
                gRunInfo.numParses = temp;
            }
            else  if (argv[argnum][0] == '-') {
                fprintf(stderr, "Unrecognized command line option.  Scanning \"%s\"\n",
                    argv[argnum]);
                throw 1;
            }
            else {
                gRunInfo.numInputFiles++;
                if (gRunInfo.numInputFiles >= MAXINFILES) {
                    fprintf(stderr, "Too many input files.  Limit is %d\n", MAXINFILES);
                    throw 1;
                }
                gRunInfo.files[gRunInfo.numInputFiles-1].fileName = argv[argnum];
            }
            argnum++;
        }

        // We've made it through the command line.
        // Verify that at least one input file to be parsed was specified.
        if (gRunInfo.numInputFiles == 0) {
            fprintf(stderr, "No input XML file specified on command line.\n");
            throw 1;
        };

        if (gRunInfo.numParses && gRunInfo.totalTime) {
            fprintf(stderr, "Both -parses nnn and -time nnn were specified. Ignoring -time nnn.\n");
        }
    }
    catch (int)
    {
        fprintf(stderr, "usage:  ThreadTest [-v] [-threads nnn] [-time nnn] [-quiet] [-verbose] xmlfile...\n"
            "     -v=xxx         Validation scheme [always | never | auto].  Default is AUTO.\n"
            "     -n             Enable namespace processing. Defaults to off.\n"
            "     -s             Enable schema processing. Defaults to off.\n"
            "     -f             Enable full schema constraint checking. Defaults to off.\n"
            "     -parser=xxx    Parser Type [dom | sax | sax2].  Default is SAX (SAX1).\n"
            "     -p             Enable namespace prefixes. Defaults to off.\n"
            "                    (Only used with -parser=sax2, ignored otherwise.)\n"
            "     -quiet         Suppress periodic status display.\n"
            "     -verbose       Display extra messages.\n"
            "     -reuse         Retain and reuse parser.  Default creates new for each parse.\n"
            "     -threads nnn   Number of threads.  Default is 2.\n"
            "     -time nnn      Total time to run, in seconds.  Default is forever.\n"
            "     -parses nnn    Run for nnn parses instead of time.  Default is to use time\n"
            "     -dump          Dump DOM tree on error.\n"
            "     -mem           Read files into memory once only, and parse them from there.\n"
            "     -gc            Enable grammar caching (i.e. grammar cached and used in subsequent parses). Defaults to off.\n"
            "     -init          Perform an initial parse of the file(s) before starting up the individual threads.\n\n"
            );
        exit(1);
    }
}